

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_remove_output(wally_psbt *psbt,uint32_t index)

{
  int local_18;
  int ret;
  uint32_t index_local;
  wally_psbt *psbt_local;
  
  if (((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) ||
     (psbt->tx->num_outputs != psbt->num_outputs)) {
    local_18 = -2;
  }
  else {
    local_18 = wally_tx_remove_output(psbt->tx,(ulong)index);
  }
  if (local_18 == 0) {
    psbt_output_free(psbt->outputs + index,false);
    memmove(psbt->outputs + index,psbt->outputs + (ulong)index + 1,
            ((psbt->num_outputs - (ulong)index) + -1) * 0xd0);
    psbt->num_outputs = psbt->num_outputs - 1;
  }
  return local_18;
}

Assistant:

int wally_psbt_remove_output(struct wally_psbt *psbt, uint32_t index)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_outputs != psbt->num_outputs)
        ret = WALLY_EINVAL;
    else
        ret = wally_tx_remove_output(psbt->tx, index);
    if (ret == WALLY_OK) {
        psbt_output_free(&psbt->outputs[index], false);
        memmove(psbt->outputs + index, psbt->outputs + index + 1,
                (psbt->num_outputs - index - 1) * sizeof(struct wally_psbt_output));
        psbt->num_outputs -= 1;
    }
    return ret;
}